

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kbdif.cpp
# Opt level: O2

bool ask_user_bool(char *szPrompt,bool bDefault)

{
  int iVar1;
  undefined7 in_register_00000031;
  char *pcVar2;
  char enter [30];
  
  enter[0x10] = '\0';
  enter[0x11] = '\0';
  enter[0x12] = '\0';
  enter[0x13] = '\0';
  enter[0x14] = '\0';
  enter[0x15] = '\0';
  enter[0x16] = '\0';
  enter[0x17] = '\0';
  enter[0x18] = '\0';
  enter[0x19] = '\0';
  enter[0x1a] = '\0';
  enter[0x1b] = '\0';
  enter[0x1c] = '\0';
  enter[0x1d] = '\0';
  pcVar2 = "y,<n>";
  iVar1 = (int)CONCAT71(in_register_00000031,bDefault);
  if (iVar1 != 0) {
    pcVar2 = "<y>,n";
  }
  enter[0] = '\0';
  enter[1] = '\0';
  enter[2] = '\0';
  enter[3] = '\0';
  enter[4] = '\0';
  enter[5] = '\0';
  enter[6] = '\0';
  enter[7] = '\0';
  enter[8] = '\0';
  enter[9] = '\0';
  enter[10] = '\0';
  enter[0xb] = '\0';
  enter[0xc] = '\0';
  enter[0xd] = '\0';
  enter[0xe] = '\0';
  enter[0xf] = '\0';
  while( true ) {
    printf("%s (%s): ",szPrompt,pcVar2);
    fgets(enter,0x1d,_stdin);
    if ((enter[0] == '\0') || (enter[0] == '\n')) goto LAB_0015a408;
    if (enter[0] == 'n') break;
    if (enter[0] == 'y') {
      iVar1 = 1;
LAB_0015a408:
      return SUB41(iVar1,0);
    }
  }
  iVar1 = 0;
  goto LAB_0015a408;
}

Assistant:

bool
ask_user_bool (const char* szPrompt, bool bDefault)
{
    char    enter[30] = "";
    const char *szSelVals;
    if(bDefault){
        szSelVals = "<y>,n";
    }else{
        szSelVals = "y,<n>";
    }

    do{
        printf("%s (%s): ", szPrompt, szSelVals);
        fgets(enter, sizeof(enter)-1, stdin);
    }while('y' != enter[0] && 'n' != enter[0] &&
	   '\0' != enter[0] && '\n' != enter[0]);

    switch(enter[0]){
    case 'y':
        return true;
    case 'n':
        return false;
    }
    return bDefault;
}